

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::VirtualToRealCoordsInt
          (DCanvas *this,int *x,int *y,int *w,int *h,int vwidth,int vheight,bool vbottom,
          bool handleaspect)

{
  double local_58;
  double dh;
  double dw;
  double dy;
  double dx;
  bool handleaspect_local;
  bool vbottom_local;
  int *piStack_30;
  int vwidth_local;
  int *h_local;
  int *w_local;
  int *y_local;
  int *x_local;
  DCanvas *this_local;
  
  dx._3_1_ = vbottom;
  dx._2_1_ = handleaspect;
  dy = (double)*x;
  dw = (double)*y;
  dh = (double)*w;
  local_58 = (double)*h;
  dx._4_4_ = vwidth;
  piStack_30 = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (int *)this;
  VirtualToRealCoords(this,&dy,&dw,&dh,&local_58,(double)vwidth,(double)vheight,vbottom,handleaspect
                     );
  *y_local = (int)(dy + 0.5);
  *w_local = (int)(dw + 0.5);
  *h_local = (int)(dy + dh + 0.5) - *y_local;
  *piStack_30 = (int)(dw + local_58 + 0.5) - *w_local;
  return;
}

Assistant:

void DCanvas::VirtualToRealCoordsInt(int &x, int &y, int &w, int &h,
	int vwidth, int vheight, bool vbottom, bool handleaspect) const
{
	double dx, dy, dw, dh;

	dx = x;
	dy = y;
	dw = w;
	dh = h;
	VirtualToRealCoords(dx, dy, dw, dh, vwidth, vheight, vbottom, handleaspect);
	x = int(dx + 0.5);
	y = int(dy + 0.5);
	w = int(dx + dw + 0.5) - x;
	h = int(dy + dh + 0.5) - y;
}